

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_singleLeafSeek_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_singleLeafSeek_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  value_view v;
  bool bVar1;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_00;
  const_reference pvVar2;
  key_type kVar3;
  iterator *piVar4;
  char *pcVar5;
  char *in_R9;
  key_view akey;
  key_view akey_00;
  key_view akey_01;
  key_view akey_02;
  uint in_stack_ffffffffffffeef8;
  undefined1 bypass_verifier;
  string local_1100;
  AssertHelper local_10e0;
  Message local_10d8;
  bool local_10c9;
  undefined1 local_10c8 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_1098;
  Message local_1090 [2];
  value_view local_1080;
  bool local_1069;
  undefined1 local_1068 [8];
  AssertionResult gtest_ar__17;
  Message local_1050;
  int local_1044;
  key_view local_1040;
  uint64_t local_1030;
  undefined1 local_1028 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_ff8;
  Message local_ff0;
  bool local_fe1;
  undefined1 local_fe0 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_fb0;
  Message local_fa8;
  bool local_f99;
  undefined1 local_f98 [8];
  AssertionResult gtest_ar__15;
  undefined1 local_f80 [8];
  iterator it_5;
  undefined1 local_e08 [7];
  bool match_5;
  AssertHelper local_de8;
  Message local_de0;
  bool local_dd1;
  undefined1 local_dd0 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_da0;
  Message local_d98;
  bool local_d89;
  undefined1 local_d88 [8];
  AssertionResult gtest_ar__13;
  undefined1 local_d70 [8];
  iterator it_4;
  undefined1 local_bf8 [7];
  bool match_4;
  AssertHelper local_bd8;
  Message local_bd0;
  bool local_bc1;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_b90;
  Message local_b88;
  bool local_b79;
  undefined1 local_b78 [8];
  AssertionResult gtest_ar__11;
  undefined1 local_b60 [8];
  iterator it_3;
  undefined1 local_9e8 [7];
  bool match_3;
  AssertHelper local_9c8;
  Message local_9c0;
  bool local_9b1;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_980;
  Message local_978 [2];
  value_view local_968;
  bool local_951;
  undefined1 local_950 [8];
  AssertionResult gtest_ar__9;
  Message local_938;
  int local_92c;
  key_view local_928;
  uint64_t local_918;
  undefined1 local_910 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_8e0;
  Message local_8d8;
  bool local_8c9;
  undefined1 local_8c8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_898;
  Message local_890;
  bool local_881;
  undefined1 local_880 [8];
  AssertionResult gtest_ar__7;
  undefined1 local_868 [8];
  iterator it_2;
  undefined1 local_6f0 [7];
  bool match_2;
  AssertHelper local_6d0;
  Message local_6c8;
  bool local_6b9;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_688;
  Message local_680 [2];
  value_view local_670;
  bool local_659;
  undefined1 local_658 [8];
  AssertionResult gtest_ar__5;
  Message local_640;
  int local_634;
  key_view local_630;
  uint64_t local_620;
  undefined1 local_618 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_5e8;
  Message local_5e0;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_5a8;
  Message local_5a0;
  bool local_591;
  undefined1 local_590 [8];
  AssertionResult gtest_ar__3;
  iterator *it_1;
  undefined1 local_568 [7];
  bool match_1;
  iterator e_1;
  AssertHelper local_3d8;
  Message local_3d0;
  bool local_3c1;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_390;
  Message local_388 [2];
  value_view local_378;
  bool local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__1;
  Message local_348;
  int local_33c;
  key_view local_338;
  uint64_t local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_1;
  Message local_308;
  bool local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2c8;
  Message local_2c0;
  bool local_2b1;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_;
  iterator *it;
  undefined1 local_288 [7];
  bool match;
  iterator e;
  TypeParam *db;
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  ARTIteratorTest_singleLeafSeek_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  bypass_verifier = 0;
  verifier.key_views.
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)(ulong)in_stack_ffffffffffffeef8,SUB81((ulong)&db >> 0x38,0));
  this_00 = unodb::test::
            tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
            ::get_db((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  v._M_ptr = pvVar2->_M_ptr;
  v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  insert<int>((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
               *)&db,1,v,(bool)bypass_verifier);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::test_only_iterator
            ((iterator *)local_288,this_00);
  it._7_1_ = 0;
  kVar3 = unodb::test::
          tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,1);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar_.message_,kVar3);
  piVar4 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
           seek((iterator *)local_288,
                (art_key_type)
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,(bool *)((long)&it + 7),true);
  local_2b1 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid(piVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b0,&local_2b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_2b0,(AssertionResult *)"it.valid()",
               "false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x140,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  local_2f9 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_2f8,"(match)","(true)",(bool *)((long)&it + 7),&local_2f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x141,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  local_338 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key(piVar4);
  akey._M_extent = local_338._M_extent._M_extent_value;
  akey._M_ptr = (pointer)akey._M_extent._M_extent_value;
  local_328 = decode((anon_unknown_dwarf_d5c8 *)local_338._M_ptr,akey);
  local_33c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_320,"(decode(it.get_key()))","(1)",&local_328,&local_33c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x142,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  local_378 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_val(piVar4);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_361 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_378,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_360,&local_361,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_360,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x144,pcVar5);
    testing::internal::AssertHelper::operator=(&local_390,local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::next
            (piVar4);
  local_3c1 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid(piVar4);
  local_3c1 = !local_3c1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3c0,&local_3c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e_1.keybuf_.off,(internal *)local_3c0,(AssertionResult *)"it.valid()",
               "true","false",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &e_1.keybuf_.off);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x146,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    std::__cxx11::string::~string((string *)&e_1.keybuf_.off);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_288);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::test_only_iterator
            ((iterator *)local_568,this_00);
  it_1._7_1_ = 0;
  kVar3 = unodb::test::
          tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,1);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__3.message_,kVar3);
  piVar4 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
           seek((iterator *)local_568,
                (art_key_type)
                gtest_ar__3.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,(bool *)((long)&it_1 + 7),false);
  local_591 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid(piVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_590,&local_591,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_590,(AssertionResult *)"it.valid()"
               ,"false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x14d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_5a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5d8,(bool *)((long)&it_1 + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_5d8,(AssertionResult *)0x30452b,
               "false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_2.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x14e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  local_630 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key(piVar4);
  akey_00._M_extent = local_630._M_extent._M_extent_value;
  akey_00._M_ptr = (pointer)akey_00._M_extent._M_extent_value;
  local_620 = decode((anon_unknown_dwarf_d5c8 *)local_630._M_ptr,akey_00);
  local_634 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_618,"(decode(it.get_key()))","(1)",&local_620,&local_634);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar1) {
    testing::Message::Message(&local_640);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x14f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_640);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  local_670 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_val(piVar4);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_659 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_670,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_658,&local_659,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
  if (!bVar1) {
    testing::Message::Message(local_680);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_658,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__6.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x151,pcVar5);
    testing::internal::AssertHelper::operator=(&local_688,local_680);
    testing::internal::AssertHelper::~AssertHelper(&local_688);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(local_680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::next
            (piVar4);
  local_6b9 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid(piVar4);
  local_6b9 = !local_6b9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6b8,&local_6b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar1) {
    testing::Message::Message(&local_6c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_6f0,(internal *)local_6b8,(AssertionResult *)"it.valid()","true",
               "false",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_6f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x153,pcVar5);
    testing::internal::AssertHelper::operator=(&local_6d0,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6d0);
    std::__cxx11::string::~string((string *)local_6f0);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_568);
  it_2.keybuf_.off._7_1_ = 1;
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::test_only_iterator
            ((iterator *)local_868,this_00);
  kVar3 = unodb::test::
          tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,0);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__7.message_,kVar3);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_868,
             (art_key_type)
             gtest_ar__7.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(bool *)((long)&it_2.keybuf_.off + 7),true);
  local_881 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)local_868);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_880,&local_881,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_880);
  if (!bVar1) {
    testing::Message::Message(&local_890);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_880,(AssertionResult *)"it.valid()"
               ,"false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__8.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_898,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x15c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_898,&local_890);
    testing::internal::AssertHelper::~AssertHelper(&local_898);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_880);
  local_8c9 = (bool)(~it_2.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8c8,&local_8c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c8);
  if (!bVar1) {
    testing::Message::Message(&local_8d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_8c8,(AssertionResult *)0x30452b,
               "true","false",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_3.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_8e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x15d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_8e0,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper(&local_8e0);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c8);
  local_928 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key((iterator *)local_868);
  akey_01._M_extent = local_928._M_extent._M_extent_value;
  akey_01._M_ptr = (pointer)akey_01._M_extent._M_extent_value;
  local_918 = decode((anon_unknown_dwarf_d5c8 *)local_928._M_ptr,akey_01);
  local_92c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_910,"(decode(it.get_key()))","(1)",&local_918,&local_92c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_910);
  if (!bVar1) {
    testing::Message::Message(&local_938);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_910);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x15e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__9.message_,&local_938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_910);
  local_968 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_val((iterator *)local_868);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_951 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_968,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_950,&local_951,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
  if (!bVar1) {
    testing::Message::Message(local_978);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_950,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__10.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_980,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x160,pcVar5);
    testing::internal::AssertHelper::operator=(&local_980,local_978);
    testing::internal::AssertHelper::~AssertHelper(&local_980);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::next
            ((iterator *)local_868);
  local_9b1 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)local_868);
  local_9b1 = !local_9b1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9b0,&local_9b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
  if (!bVar1) {
    testing::Message::Message(&local_9c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_9e8,(internal *)local_9b0,(AssertionResult *)"it.valid()","true",
               "false",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_9e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x162,pcVar5);
    testing::internal::AssertHelper::operator=(&local_9c8,&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    std::__cxx11::string::~string((string *)local_9e8);
    testing::Message::~Message(&local_9c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_868);
  it_3.keybuf_.off._7_1_ = 1;
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::test_only_iterator
            ((iterator *)local_b60,this_00);
  kVar3 = unodb::test::
          tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,2);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__11.message_,kVar3);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_b60,
             (art_key_type)
             gtest_ar__11.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(bool *)((long)&it_3.keybuf_.off + 7),true);
  local_b79 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)local_b60);
  local_b79 = !local_b79;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b78,&local_b79,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b78);
  if (!bVar1) {
    testing::Message::Message(&local_b88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_b78,
               (AssertionResult *)"it.valid()","true","false",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__12.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_b90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x16a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_b90,&local_b88);
    testing::internal::AssertHelper::~AssertHelper(&local_b90);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_b88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b78);
  local_bc1 = (bool)(~it_3.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bc0,&local_bc1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar1) {
    testing::Message::Message(&local_bd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_bf8,(internal *)local_bc0,(AssertionResult *)0x30452b,"true","false",
               in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_bf8);
    testing::internal::AssertHelper::AssertHelper
              (&local_bd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x16b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_bd8,&local_bd0);
    testing::internal::AssertHelper::~AssertHelper(&local_bd8);
    std::__cxx11::string::~string((string *)local_bf8);
    testing::Message::~Message(&local_bd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_b60);
  it_4.keybuf_.off._7_1_ = 1;
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::test_only_iterator
            ((iterator *)local_d70,this_00);
  kVar3 = unodb::test::
          tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,0);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__13.message_,kVar3);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_d70,
             (art_key_type)
             gtest_ar__13.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(bool *)((long)&it_4.keybuf_.off + 7),false);
  local_d89 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)local_d70);
  local_d89 = !local_d89;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d88,&local_d89,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d88);
  if (!bVar1) {
    testing::Message::Message(&local_d98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_d88,
               (AssertionResult *)"it.valid()","true","false",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__14.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_da0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x173,pcVar5);
    testing::internal::AssertHelper::operator=(&local_da0,&local_d98);
    testing::internal::AssertHelper::~AssertHelper(&local_da0);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_d98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d88);
  local_dd1 = (bool)(~it_4.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_dd0,&local_dd1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd0);
  if (!bVar1) {
    testing::Message::Message(&local_de0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e08,(internal *)local_dd0,(AssertionResult *)0x30452b,"true","false",
               in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_e08);
    testing::internal::AssertHelper::AssertHelper
              (&local_de8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x174,pcVar5);
    testing::internal::AssertHelper::operator=(&local_de8,&local_de0);
    testing::internal::AssertHelper::~AssertHelper(&local_de8);
    std::__cxx11::string::~string((string *)local_e08);
    testing::Message::~Message(&local_de0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd0);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_d70);
  it_5.keybuf_.off._7_1_ = 1;
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::test_only_iterator
            ((iterator *)local_f80,this_00);
  kVar3 = unodb::test::
          tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,2);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__15.message_,kVar3);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_f80,
             (art_key_type)
             gtest_ar__15.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(bool *)((long)&it_5.keybuf_.off + 7),false);
  local_f99 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)local_f80);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f98,&local_f99,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f98);
  if (!bVar1) {
    testing::Message::Message(&local_fa8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_f98,
               (AssertionResult *)"it.valid()","false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__16.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_fb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x17c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_fb0,&local_fa8);
    testing::internal::AssertHelper::~AssertHelper(&local_fb0);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_fa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f98);
  local_fe1 = (bool)(~it_5.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fe0,&local_fe1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fe0);
  if (!bVar1) {
    testing::Message::Message(&local_ff0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_fe0,(AssertionResult *)0x30452b,
               "true","false",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_4.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x17d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_ff8,&local_ff0);
    testing::internal::AssertHelper::~AssertHelper(&local_ff8);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_ff0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fe0);
  local_1040 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::get_key((iterator *)local_f80);
  akey_02._M_extent = local_1040._M_extent._M_extent_value;
  akey_02._M_ptr = (pointer)akey_02._M_extent._M_extent_value;
  local_1030 = decode((anon_unknown_dwarf_d5c8 *)local_1040._M_ptr,akey_02);
  local_1044 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1028,"(decode(it.get_key()))","(1)",&local_1030,&local_1044);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1028);
  if (!bVar1) {
    testing::Message::Message(&local_1050);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1028);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x17e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__17.message_,&local_1050);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_1050);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1028);
  local_1080 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::get_val((iterator *)local_f80);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_1069 = std::ranges::__equal_fn::
               operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                         ((__equal_fn *)&std::ranges::equal,&local_1080,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1068,&local_1069,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1068);
  if (!bVar1) {
    testing::Message::Message(local_1090);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_1068,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__18.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x180,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1098,local_1090);
    testing::internal::AssertHelper::~AssertHelper(&local_1098);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(local_1090);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1068);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::next
            ((iterator *)local_f80);
  local_10c9 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::valid((iterator *)local_f80);
  local_10c9 = !local_10c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10c8,&local_10c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10c8);
  if (!bVar1) {
    testing::Message::Message(&local_10d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1100,(internal *)local_10c8,(AssertionResult *)"it.valid()","true","false",
               in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1100);
    testing::internal::AssertHelper::AssertHelper
              (&local_10e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x182,pcVar5);
    testing::internal::AssertHelper::operator=(&local_10e0,&local_10d8);
    testing::internal::AssertHelper::~AssertHelper(&local_10e0);
    std::__cxx11::string::~string((string *)&local_1100);
    testing::Message::~Message(&local_10d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10c8);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_f80);
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  ~tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *)&db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, singleLeafSeek) {
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(1, unodb::test::test_values[1]);
  {  // exact match, forward traversal (GTE)
    auto e = db.test_only_iterator();
    bool match = false;
    auto& it = e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(1)},
                      match, true /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_EQ(match, true);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
  {  // exact match, reverse traversal (LTE)
    auto e = db.test_only_iterator();
    bool match = false;
    auto& it = e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(1)},
                      match, false /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_TRUE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());  // nothing more in the iterator.
  }
  {  // forward traversal, before the first key in the data.
    // match=false and iterator is positioned on the first key in the
    // data.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
            true /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_FALSE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
  {  // forward traversal, after the last key in the data.  match=false
    // and iterator is invalidated.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(2)}, match,
            true /*fwd*/);
    UNODB_EXPECT_FALSE(it.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {  // reverse traversal, before the first key in the data.
    // match=false and iterator is invalidated.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
            false /*fwd*/);
    UNODB_EXPECT_FALSE(it.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {  // reverse traversal, after the last key in the data.  match=false
    // and iterator is positioned at the last key.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(2)}, match,
            false /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_FALSE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
}